

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model_sampling(V *values,int num_keys,LinearModel<int> *model,bool verbose)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar15 [16];
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar29 [16];
  double dVar30;
  double local_110;
  double local_108;
  undefined1 local_e8 [96];
  undefined8 uStack_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar14;
  
  if (num_keys < 0x15) {
    build_model(values,num_keys,model,false);
    return;
  }
  dVar21 = (double)num_keys;
  uVar13 = 1;
  do {
    uVar12 = uVar13;
    dVar21 = dVar21 * 0.5;
    uVar13 = uVar12 * 2;
  } while (10.0 <= dVar21);
  uVar12 = uVar12 & 0x7fffffff;
  uVar14 = (ulong)uVar12;
  local_e8._64_10_ = (unkbyte10)0;
  uVar9 = 0;
  auVar22 = ZEXT816(0xffefffffffffffff);
  auVar27 = ZEXT816(0x7fefffffffffffff);
  local_e8._84_4_ = -0x80000000;
  local_e8._80_4_ = 0x7fffffff;
  local_e8._8_4_ = 0;
  local_e8._48_10_ = local_e8._64_10_;
  local_e8._32_10_ = local_e8._64_10_;
  local_e8._16_10_ = local_e8._64_10_;
  do {
    iVar6 = values[uVar9].first;
    local_e8._8_4_ = local_e8._8_4_ + 1;
    lVar16 = (longdouble)iVar6;
    local_e8._16_10_ = (longdouble)local_e8._16_10_ + lVar16;
    lVar17 = (longdouble)(int)uVar9;
    local_e8._32_10_ = (longdouble)local_e8._32_10_ + lVar17;
    local_e8._48_10_ = lVar16 * lVar16 + (longdouble)local_e8._48_10_;
    local_e8._64_10_ = lVar17 * lVar16 + (longdouble)local_e8._64_10_;
    if (iVar6 <= (int)local_e8._80_4_) {
      local_e8._80_4_ = iVar6;
    }
    if (iVar6 < (int)local_e8._84_4_) {
      iVar6 = local_e8._84_4_;
    }
    local_e8._84_4_ = iVar6;
    auVar28._0_8_ = (double)(int)uVar9;
    auVar28._8_8_ = in_XMM3_Qa;
    auVar27 = vminsd_avx(auVar27,auVar28);
    auVar22 = vmaxsd_avx(auVar22,auVar28);
    uVar9 = uVar9 + uVar14;
  } while (uVar9 < (uint)num_keys);
  uStack_88 = auVar22._0_8_;
  local_e8._88_8_ = auVar27._0_8_;
  local_e8._0_8_ = model;
  LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_e8);
  local_108 = model->a_;
  local_110 = model->b_;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Build index, sample size: ",0x1a);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)num_keys / uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (a, b): (",10);
    poVar7 = std::ostream::_M_insert<double>(local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    poVar7 = std::ostream::_M_insert<double>(local_110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  local_48 = 0x7fffffffffffffff;
  uStack_40 = 0x7fffffffffffffff;
  do {
    if ((uint)uVar14 < 2) {
      return;
    }
    uVar13 = (uint)uVar14 >> 1;
    uVar14 = (ulong)uVar13;
    auVar26 = ZEXT1664(stack0xffffffffffffff70);
    iVar10 = 0;
    lVar16 = (longdouble)local_e8._16_10_;
    lVar17 = (longdouble)local_e8._32_10_;
    lVar20 = (longdouble)local_e8._48_10_;
    lVar19 = (longdouble)local_e8._64_10_;
    iVar6 = local_e8._84_4_;
    iVar8 = local_e8._80_4_;
    iVar11 = local_e8._8_4_;
    do {
      iVar10 = iVar10 + uVar13;
      if (iVar10 < num_keys) {
        iVar1 = values[iVar10].first;
        iVar11 = iVar11 + 1;
        lVar18 = (longdouble)iVar1;
        lVar16 = lVar16 + lVar18;
        lVar17 = lVar17 + (longdouble)iVar10;
        lVar20 = lVar18 * lVar18 + lVar20;
        lVar19 = (longdouble)iVar10 * lVar18 + lVar19;
        if (iVar1 <= iVar8) {
          iVar8 = iVar1;
        }
        if (iVar6 <= iVar1) {
          iVar6 = iVar1;
        }
        auVar27._0_8_ = (double)iVar10;
        iVar10 = iVar10 + uVar13;
        local_e8._84_4_ = iVar6;
        local_e8._80_4_ = iVar8;
        auVar27._8_8_ = auVar27._0_8_;
        auVar22 = vunpcklpd_avx(auVar26._0_16_,auVar27);
        auVar29._8_8_ = auVar26._8_8_;
        auVar29._0_8_ = auVar27._0_8_;
        uVar9 = vcmppd_avx512vl(auVar22,auVar29,1);
        bVar2 = (bool)((byte)(uVar9 & 3) & 1);
        local_e8._88_8_ = (ulong)bVar2 * auVar26._0_8_ | (ulong)!bVar2 * (long)auVar27._0_8_;
        uVar9 = (uVar9 & 3) >> 1;
        uStack_88 = uVar9 * auVar26._8_8_ | (ulong)!SUB81(uVar9,0) * (long)auVar27._0_8_;
        auVar26 = ZEXT1664(register0x000008fc);
        local_e8._8_4_ = iVar11;
        local_e8._16_10_ = lVar16;
        local_e8._32_10_ = lVar17;
        local_e8._48_10_ = lVar20;
        local_e8._64_10_ = lVar19;
      }
    } while (iVar10 < num_keys);
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_e8);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = model->a_;
    if ((local_108 != 0.0) || (NAN(local_108))) {
      auVar23._0_8_ = (model->a_ - local_108) / local_108;
      auVar23._8_8_ = 0;
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar15 = vandpd_avx512vl(auVar23,auVar4);
    }
    else {
      uVar3 = vcmpsd_avx512f(auVar22,ZEXT816(0) << 0x40,4);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (ulong)((byte)uVar3 & 1) * 0x3ff0000000000000;
    }
    auVar5._8_8_ = uStack_40;
    auVar5._0_8_ = local_48;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = model->b_ - local_110;
    auVar22 = vandpd_avx(auVar24,auVar5);
    auVar25._0_8_ = auVar22._0_8_ / local_110;
    auVar25._8_8_ = auVar22._8_8_;
    local_68 = vandpd_avx(auVar25,auVar5);
    dVar21 = auVar15._0_8_;
    dVar30 = auVar22._0_8_;
    if (verbose) {
      local_78 = auVar15;
      local_58 = auVar22;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Build index, sample size: ",0x1a);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)num_keys / uVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (a, b): (",10);
      poVar7 = std::ostream::_M_insert<double>(model->a_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::ostream::_M_insert<double>(model->b_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") (",3);
      poVar7 = std::ostream::_M_insert<double>((double)local_78._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::ostream::_M_insert<double>((double)local_68._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      dVar21 = (double)local_78._0_8_;
      dVar30 = (double)local_58._0_8_;
    }
    if ((0.01 <= dVar21) || ((bVar2 = false, 0.5 <= dVar30 && (0.01 <= (double)local_68._0_8_)))) {
      local_108 = model->a_;
      local_110 = model->b_;
      bVar2 = true;
    }
  } while (bVar2);
  return;
}

Assistant:

static void build_model_sampling(const V* values, int num_keys,
                                   LinearModel<T>* model,
                                   bool verbose = false) {
    const static int sample_size_lower_bound = 10;
    // If slope and intercept change by less than this much between samples,
    // return
    const static double rel_change_threshold = 0.01;
    // If intercept changes by less than this much between samples, return
    const static double abs_change_threshold = 0.5;
    // Increase sample size by this many times each iteration
    const static int sample_size_multiplier = 2;

    // If the number of keys is sufficiently small, we do not sample
    if (num_keys <= sample_size_lower_bound * sample_size_multiplier) {
      build_model(values, num_keys, model, false);
      return;
    }

    int step_size = 1;
    double sample_size = num_keys;
    while (sample_size >= sample_size_lower_bound) {
      sample_size /= sample_size_multiplier;
      step_size *= sample_size_multiplier;
    }
    step_size /= sample_size_multiplier;

    // Run with initial step size
    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i += step_size) {
      builder.add(values[i].first, i);
    }
    builder.build();
    double prev_a = model->a_;
    double prev_b = model->b_;
    if (verbose) {
      std::cout << "Build index, sample size: " << num_keys / step_size
                << " (a, b): (" << prev_a << ", " << prev_b << ")" << std::endl;
    }

    // Keep decreasing step size (increasing sample size) until model does not
    // change significantly
    while (step_size > 1) {
      step_size /= sample_size_multiplier;
      // Need to avoid processing keys we already processed in previous samples
      int i = 0;
      while (i < num_keys) {
        i += step_size;
        for (int j = 1; (j < sample_size_multiplier) && (i < num_keys);
             j++, i += step_size) {
          builder.add(values[i].first, i);
        }
      }
      builder.build();

      double rel_change_in_a = prev_a == 0 ? (model->a_ != 0) 
                               : std::abs((model->a_ - prev_a) / prev_a);
      double abs_change_in_b = std::abs(model->b_ - prev_b);
      double rel_change_in_b = std::abs(abs_change_in_b / prev_b);
      if (verbose) {
        std::cout << "Build index, sample size: " << num_keys / step_size
                  << " (a, b): (" << model->a_ << ", " << model->b_ << ") ("
                  << rel_change_in_a << ", " << rel_change_in_b << ")"
                  << std::endl;
      }
      if (rel_change_in_a < rel_change_threshold &&
          (rel_change_in_b < rel_change_threshold ||
           abs_change_in_b < abs_change_threshold)) {
        return;
      }
      prev_a = model->a_;
      prev_b = model->b_;
    }
  }